

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O0

void secp256k1_modinv64_update_fg_62
               (secp256k1_modinv64_signed62 *f,secp256k1_modinv64_signed62 *g,
               secp256k1_modinv64_trans2x2 *t)

{
  uint64_t uVar1;
  ulong uVar2;
  int64_t *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  secp256k1_int128 cg;
  secp256k1_int128 cf;
  int64_t r;
  int64_t q;
  int64_t v;
  int64_t u;
  int64_t g4;
  int64_t g3;
  int64_t g2;
  int64_t g1;
  int64_t g0;
  int64_t f4;
  int64_t f3;
  int64_t f2;
  int64_t f1;
  int64_t f0;
  uint64_t M62;
  secp256k1_int128 sStack_b8;
  secp256k1_int128 local_a8;
  int64_t local_90;
  int64_t local_88;
  int64_t local_80;
  int64_t local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  undefined8 local_20;
  ulong *local_10;
  ulong *local_8;
  
  local_20 = 0x3fffffffffffffff;
  local_28 = *in_RDI;
  local_30 = in_RDI[1];
  local_38 = in_RDI[2];
  local_40 = in_RDI[3];
  local_48 = in_RDI[4];
  local_50 = *in_RSI;
  local_58 = in_RSI[1];
  local_60 = in_RSI[2];
  local_68 = in_RSI[3];
  local_70 = in_RSI[4];
  local_78 = *in_RDX;
  local_80 = in_RDX[1];
  local_88 = in_RDX[2];
  local_90 = in_RDX[3];
  local_10 = in_RSI;
  local_8 = in_RDI;
  secp256k1_i128_mul(&local_a8,local_78,local_28);
  secp256k1_i128_accum_mul(&local_a8,local_80,local_50);
  secp256k1_i128_mul(&sStack_b8,local_88,local_28);
  secp256k1_i128_accum_mul(&sStack_b8,local_90,local_50);
  secp256k1_i128_rshift(&local_a8,0x3e);
  secp256k1_i128_rshift(&sStack_b8,0x3e);
  secp256k1_i128_accum_mul(&local_a8,local_78,local_30);
  secp256k1_i128_accum_mul(&local_a8,local_80,local_58);
  secp256k1_i128_accum_mul(&sStack_b8,local_88,local_30);
  secp256k1_i128_accum_mul(&sStack_b8,local_90,local_58);
  uVar1 = secp256k1_i128_to_u64(&local_a8);
  *local_8 = uVar1 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(&local_a8,0x3e);
  uVar1 = secp256k1_i128_to_u64(&sStack_b8);
  *local_10 = uVar1 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(&sStack_b8,0x3e);
  secp256k1_i128_accum_mul(&local_a8,local_78,local_38);
  secp256k1_i128_accum_mul(&local_a8,local_80,local_60);
  secp256k1_i128_accum_mul(&sStack_b8,local_88,local_38);
  secp256k1_i128_accum_mul(&sStack_b8,local_90,local_60);
  uVar1 = secp256k1_i128_to_u64(&local_a8);
  local_8[1] = uVar1 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(&local_a8,0x3e);
  uVar1 = secp256k1_i128_to_u64(&sStack_b8);
  local_10[1] = uVar1 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(&sStack_b8,0x3e);
  secp256k1_i128_accum_mul(&local_a8,local_78,local_40);
  secp256k1_i128_accum_mul(&local_a8,local_80,local_68);
  secp256k1_i128_accum_mul(&sStack_b8,local_88,local_40);
  secp256k1_i128_accum_mul(&sStack_b8,local_90,local_68);
  uVar1 = secp256k1_i128_to_u64(&local_a8);
  local_8[2] = uVar1 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(&local_a8,0x3e);
  uVar1 = secp256k1_i128_to_u64(&sStack_b8);
  local_10[2] = uVar1 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(&sStack_b8,0x3e);
  secp256k1_i128_accum_mul(&local_a8,local_78,local_48);
  secp256k1_i128_accum_mul(&local_a8,local_80,local_70);
  secp256k1_i128_accum_mul(&sStack_b8,local_88,local_48);
  secp256k1_i128_accum_mul(&sStack_b8,local_90,local_70);
  uVar1 = secp256k1_i128_to_u64(&local_a8);
  local_8[3] = uVar1 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(&local_a8,0x3e);
  uVar1 = secp256k1_i128_to_u64(&sStack_b8);
  local_10[3] = uVar1 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(&sStack_b8,0x3e);
  uVar2 = secp256k1_i128_to_i64(&local_a8);
  local_8[4] = uVar2;
  uVar2 = secp256k1_i128_to_i64(&sStack_b8);
  local_10[4] = uVar2;
  return;
}

Assistant:

static void secp256k1_modinv64_update_fg_62(secp256k1_modinv64_signed62 *f, secp256k1_modinv64_signed62 *g, const secp256k1_modinv64_trans2x2 *t) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const int64_t f0 = f->v[0], f1 = f->v[1], f2 = f->v[2], f3 = f->v[3], f4 = f->v[4];
    const int64_t g0 = g->v[0], g1 = g->v[1], g2 = g->v[2], g3 = g->v[3], g4 = g->v[4];
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    secp256k1_int128 cf, cg;
    /* Start computing t*[f,g]. */
    secp256k1_i128_mul(&cf, u, f0);
    secp256k1_i128_accum_mul(&cf, v, g0);
    secp256k1_i128_mul(&cg, q, f0);
    secp256k1_i128_accum_mul(&cg, r, g0);
    /* Verify that the bottom 62 bits of the result are zero, and then throw them away. */
    VERIFY_CHECK((secp256k1_i128_to_u64(&cf) & M62) == 0); secp256k1_i128_rshift(&cf, 62);
    VERIFY_CHECK((secp256k1_i128_to_u64(&cg) & M62) == 0); secp256k1_i128_rshift(&cg, 62);
    /* Compute limb 1 of t*[f,g], and store it as output limb 0 (= down shift). */
    secp256k1_i128_accum_mul(&cf, u, f1);
    secp256k1_i128_accum_mul(&cf, v, g1);
    secp256k1_i128_accum_mul(&cg, q, f1);
    secp256k1_i128_accum_mul(&cg, r, g1);
    f->v[0] = secp256k1_i128_to_u64(&cf) & M62; secp256k1_i128_rshift(&cf, 62);
    g->v[0] = secp256k1_i128_to_u64(&cg) & M62; secp256k1_i128_rshift(&cg, 62);
    /* Compute limb 2 of t*[f,g], and store it as output limb 1. */
    secp256k1_i128_accum_mul(&cf, u, f2);
    secp256k1_i128_accum_mul(&cf, v, g2);
    secp256k1_i128_accum_mul(&cg, q, f2);
    secp256k1_i128_accum_mul(&cg, r, g2);
    f->v[1] = secp256k1_i128_to_u64(&cf) & M62; secp256k1_i128_rshift(&cf, 62);
    g->v[1] = secp256k1_i128_to_u64(&cg) & M62; secp256k1_i128_rshift(&cg, 62);
    /* Compute limb 3 of t*[f,g], and store it as output limb 2. */
    secp256k1_i128_accum_mul(&cf, u, f3);
    secp256k1_i128_accum_mul(&cf, v, g3);
    secp256k1_i128_accum_mul(&cg, q, f3);
    secp256k1_i128_accum_mul(&cg, r, g3);
    f->v[2] = secp256k1_i128_to_u64(&cf) & M62; secp256k1_i128_rshift(&cf, 62);
    g->v[2] = secp256k1_i128_to_u64(&cg) & M62; secp256k1_i128_rshift(&cg, 62);
    /* Compute limb 4 of t*[f,g], and store it as output limb 3. */
    secp256k1_i128_accum_mul(&cf, u, f4);
    secp256k1_i128_accum_mul(&cf, v, g4);
    secp256k1_i128_accum_mul(&cg, q, f4);
    secp256k1_i128_accum_mul(&cg, r, g4);
    f->v[3] = secp256k1_i128_to_u64(&cf) & M62; secp256k1_i128_rshift(&cf, 62);
    g->v[3] = secp256k1_i128_to_u64(&cg) & M62; secp256k1_i128_rshift(&cg, 62);
    /* What remains is limb 5 of t*[f,g]; store it as output limb 4. */
    f->v[4] = secp256k1_i128_to_i64(&cf);
    g->v[4] = secp256k1_i128_to_i64(&cg);
}